

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

array_container_t * array_container_create_given_capacity(int32_t size)

{
  uint16_t *puVar1;
  array_container_t *container;
  array_container_t *paStack_10;
  int32_t size_local;
  
  paStack_10 = (array_container_t *)malloc(0x10);
  if (paStack_10 == (array_container_t *)0x0) {
    paStack_10 = (array_container_t *)0x0;
  }
  else {
    if (size < 1) {
      paStack_10->array = (uint16_t *)0x0;
    }
    else {
      puVar1 = (uint16_t *)malloc((long)size << 1);
      paStack_10->array = puVar1;
      if (puVar1 == (uint16_t *)0x0) {
        free(paStack_10);
        return (array_container_t *)0x0;
      }
    }
    paStack_10->capacity = size;
    paStack_10->cardinality = 0;
  }
  return paStack_10;
}

Assistant:

array_container_t *array_container_create_given_capacity(int32_t size) {
    array_container_t *container;

    if ((container = (array_container_t *)malloc(sizeof(array_container_t))) ==
        NULL) {
        return NULL;
    }

    if( size <= 0 ) { // we don't want to rely on malloc(0)
        container->array = NULL;
    } else if ((container->array = (uint16_t *)malloc(sizeof(uint16_t) * size)) ==
        NULL) {
        free(container);
        return NULL;
    }

    container->capacity = size;
    container->cardinality = 0;

    return container;
}